

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O2

void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx,uchar *seed32)

{
  int iVar1;
  undefined4 extraout_EAX;
  long lVar2;
  size_t outlen;
  size_t outlen_00;
  secp256k1_gej *psVar3;
  secp256k1_gej *psVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  uchar auStack_1a8 [40];
  secp256k1_scalar local_180;
  secp256k1_fe s;
  uchar local_138 [32];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  secp256k1_rfc6979_hmac_sha256 local_ec;
  secp256k1_gej gb;
  
  bVar5 = 0;
  if (seed32 == (uchar *)0x0) {
    (ctx->initial).infinity = 0;
    (ctx->initial).x.n[0] = 0x2815b16f81798;
    (ctx->initial).x.n[1] = 0xdb2dce28d959f;
    (ctx->initial).x.n[2] = 0xe870b07029bfc;
    (ctx->initial).x.n[3] = 0xbbac55a06295c;
    (ctx->initial).x.n[4] = 0x79be667ef9dc;
    (ctx->initial).y.n[0] = 0x7d08ffb10d4b8;
    (ctx->initial).y.n[1] = 0x48a68554199c4;
    (ctx->initial).y.n[2] = 0xe1108a8fd17b4;
    (ctx->initial).y.n[3] = 0xc4655da4fbfc0;
    (ctx->initial).y.n[4] = 0x483ada7726a3;
    (ctx->initial).z.n[0] = 1;
    (ctx->initial).z.n[1] = 0;
    (ctx->initial).z.n[2] = 0;
    (ctx->initial).z.n[3] = 0;
    (ctx->initial).z.n[4] = 0;
    secp256k1_gej_neg(&ctx->initial,&ctx->initial);
    (ctx->blind).d[0] = 1;
    (ctx->blind).d[1] = 0;
    (ctx->blind).d[2] = 0;
    (ctx->blind).d[3] = 0;
  }
  else {
    secp256k1_scalar_get_b32(local_138,&ctx->blind);
    local_118 = *(undefined8 *)seed32;
    uStack_110 = *(undefined8 *)(seed32 + 8);
    local_108 = *(undefined8 *)(seed32 + 0x10);
    uStack_100 = *(undefined8 *)(seed32 + 0x18);
    secp256k1_rfc6979_hmac_sha256_initialize(&local_ec,local_138,0x40);
    secp256k1_rfc6979_hmac_sha256_generate(&local_ec,auStack_1a8,outlen);
    secp256k1_fe_impl_set_b32_mod(&s,auStack_1a8);
    iVar1 = secp256k1_fe_impl_normalizes_to_zero(&s);
    secp256k1_fe_impl_cmov(&s,&secp256k1_fe_one,iVar1);
    secp256k1_gej_rescale(&ctx->initial,&s);
    secp256k1_fe_impl_clear(&s);
    secp256k1_rfc6979_hmac_sha256_generate(&local_ec,auStack_1a8,outlen_00);
    secp256k1_scalar_set_b32(&local_180,auStack_1a8,(int *)0x0);
    auVar6._0_4_ = -(uint)((int)local_180.d[2] == 0 && (int)local_180.d[0] == 0);
    auVar6._4_4_ = -(uint)(local_180.d[2]._4_4_ == 0 && local_180.d[0]._4_4_ == 0);
    auVar6._8_4_ = -(uint)((int)local_180.d[3] == 0 && (int)local_180.d[1] == 0);
    auVar6._12_4_ = -(uint)(local_180.d[3]._4_4_ == 0 && local_180.d[1]._4_4_ == 0);
    iVar1 = movmskps(extraout_EAX,auVar6);
    secp256k1_scalar_cmov(&local_180,&secp256k1_scalar_one,(uint)(iVar1 == 0xf));
    secp256k1_ecmult_gen(ctx,&gb,&local_180);
    secp256k1_scalar_negate(&local_180,&local_180);
    (ctx->blind).d[2] = CONCAT44(local_180.d[2]._4_4_,(int)local_180.d[2]);
    (ctx->blind).d[3] = CONCAT44(local_180.d[3]._4_4_,(int)local_180.d[3]);
    (ctx->blind).d[0] = CONCAT44(local_180.d[0]._4_4_,(int)local_180.d[0]);
    (ctx->blind).d[1] = CONCAT44(local_180.d[1]._4_4_,(int)local_180.d[1]);
    psVar3 = &gb;
    psVar4 = &ctx->initial;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      (psVar4->x).n[0] = (psVar3->x).n[0];
      psVar3 = (secp256k1_gej *)((long)psVar3 + (ulong)bVar5 * -0x10 + 8);
      psVar4 = (secp256k1_gej *)((long)psVar4 + (ulong)bVar5 * -0x10 + 8);
    }
    secp256k1_gej_clear(&gb);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx, const unsigned char *seed32) {
    secp256k1_scalar b;
    secp256k1_gej gb;
    secp256k1_fe s;
    unsigned char nonce32[32];
    secp256k1_rfc6979_hmac_sha256 rng;
    unsigned char keydata[64];
    if (seed32 == NULL) {
        /* When seed is NULL, reset the initial point and blinding value. */
        secp256k1_gej_set_ge(&ctx->initial, &secp256k1_ge_const_g);
        secp256k1_gej_neg(&ctx->initial, &ctx->initial);
        secp256k1_scalar_set_int(&ctx->blind, 1);
        return;
    }
    /* The prior blinding value (if not reset) is chained forward by including it in the hash. */
    secp256k1_scalar_get_b32(keydata, &ctx->blind);
    /** Using a CSPRNG allows a failure free interface, avoids needing large amounts of random data,
     *   and guards against weak or adversarial seeds.  This is a simpler and safer interface than
     *   asking the caller for blinding values directly and expecting them to retry on failure.
     */
    VERIFY_CHECK(seed32 != NULL);
    memcpy(keydata + 32, seed32, 32);
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, keydata, 64);
    memset(keydata, 0, sizeof(keydata));
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_fe_set_b32_mod(&s, nonce32);
    secp256k1_fe_cmov(&s, &secp256k1_fe_one, secp256k1_fe_normalizes_to_zero(&s));
    /* Randomize the projection to defend against multiplier sidechannels.
       Do this before our own call to secp256k1_ecmult_gen below. */
    secp256k1_gej_rescale(&ctx->initial, &s);
    secp256k1_fe_clear(&s);
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_scalar_set_b32(&b, nonce32, NULL);
    /* A blinding value of 0 works, but would undermine the projection hardening. */
    secp256k1_scalar_cmov(&b, &secp256k1_scalar_one, secp256k1_scalar_is_zero(&b));
    secp256k1_rfc6979_hmac_sha256_finalize(&rng);
    memset(nonce32, 0, 32);
    /* The random projection in ctx->initial ensures that gb will have a random projection. */
    secp256k1_ecmult_gen(ctx, &gb, &b);
    secp256k1_scalar_negate(&b, &b);
    ctx->blind = b;
    ctx->initial = gb;
    secp256k1_scalar_clear(&b);
    secp256k1_gej_clear(&gb);
}